

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O2

void fai_insert_index(faidx_t *idx,char *name,int len,int line_len,int line_blen,uint64_t offset)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  kh_s_t *h;
  khint32_t *pkVar4;
  faidx1_t *pfVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  char **ppcVar10;
  char *pcVar11;
  sbyte sVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  khint_t kVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  bool bVar20;
  
  iVar7 = idx->n;
  if (iVar7 == idx->m) {
    iVar9 = 0x10;
    if (iVar7 != 0) {
      iVar9 = iVar7 * 2;
    }
    idx->m = iVar9;
    ppcVar10 = (char **)realloc(idx->name,(long)iVar9 << 3);
    idx->name = ppcVar10;
    iVar7 = idx->n;
  }
  else {
    ppcVar10 = idx->name;
  }
  pcVar11 = strdup(name);
  ppcVar10[iVar7] = pcVar11;
  h = idx->hash;
  pcVar11 = idx->name[iVar7];
  if (h->upper_bound <= h->n_occupied) {
    uVar3 = h->n_buckets;
    if (h->size * 2 < uVar3) {
      kVar16 = uVar3 - 1;
    }
    else {
      kVar16 = uVar3 + 1;
    }
    iVar7 = kh_resize_s(h,kVar16);
    if (iVar7 < 0) {
      uVar15 = (ulong)h->n_buckets;
      goto LAB_00134d07;
    }
  }
  uVar3 = h->n_buckets;
  kVar16 = __ac_X31_hash_string(pcVar11);
  uVar17 = kVar16 & uVar3 - 1;
  uVar15 = (ulong)uVar17;
  pkVar4 = h->flags;
  if ((pkVar4[uVar17 >> 4] >> ((char)uVar17 * '\x02' & 0x1fU) & 2) == 0) {
    iVar7 = 1;
    uVar15 = (ulong)uVar3;
    uVar18 = uVar17;
    do {
      uVar14 = pkVar4[uVar18 >> 4];
      uVar19 = uVar18 * 2 & 0x1e;
      sVar12 = (sbyte)uVar19;
      uVar8 = uVar14 >> sVar12;
      if (((uVar8 & 2) != 0) ||
         (((uVar8 & 1) == 0 && (iVar9 = strcmp(h->keys[uVar18],pcVar11), iVar9 == 0)))) {
        bVar20 = (uVar14 >> sVar12 & 2) == 0;
        uVar14 = (uint)uVar15;
        goto LAB_00134c82;
      }
      if ((uVar14 >> uVar19 & 1) != 0) {
        uVar15 = (ulong)uVar18;
      }
      uVar18 = uVar18 + iVar7 & uVar3 - 1;
      iVar7 = iVar7 + 1;
    } while (uVar18 != uVar17);
    bVar20 = true;
    uVar14 = uVar3;
    uVar18 = uVar17;
    if ((uint)uVar15 == uVar3) {
LAB_00134c82:
      if (uVar14 == uVar3) {
        uVar14 = uVar18;
      }
      if (bVar20) {
        uVar14 = uVar18;
      }
      uVar15 = (ulong)uVar14;
    }
  }
  uVar6 = uVar15 >> 4;
  bVar13 = (char)uVar15 * '\x02' & 0x1e;
  if ((pkVar4[uVar6] >> bVar13 & 2) == 0) {
    if ((pkVar4[uVar6] >> bVar13 & 1) != 0) {
      h->keys[uVar15] = pcVar11;
      h->flags[uVar6] = h->flags[uVar6] & ~(3 << bVar13);
      h->size = h->size + 1;
    }
  }
  else {
    h->keys[uVar15] = pcVar11;
    h->flags[uVar6] = h->flags[uVar6] & ~(3 << bVar13);
    uVar1 = h->size;
    uVar2 = h->n_occupied;
    h->size = uVar1 + 1;
    h->n_occupied = uVar2 + 1;
  }
LAB_00134d07:
  pfVar5 = idx->hash->vals;
  pfVar5[uVar15].line_len = line_len;
  pfVar5[uVar15].line_blen = line_blen;
  pfVar5[uVar15].len = (long)len;
  pfVar5[uVar15].offset = offset;
  idx->n = idx->n + 1;
  return;
}

Assistant:

static inline void fai_insert_index(faidx_t *idx, const char *name, int len, int line_len, int line_blen, uint64_t offset)
{
    khint_t k;
    int ret;
    faidx1_t t;
    if (idx->n == idx->m) {
        idx->m = idx->m? idx->m<<1 : 16;
        idx->name = (char**)realloc(idx->name, sizeof(char*) * idx->m);
    }
    idx->name[idx->n] = strdup(name);
    k = kh_put(s, idx->hash, idx->name[idx->n], &ret);
    t.len = len; t.line_len = line_len; t.line_blen = line_blen; t.offset = offset;
    kh_value(idx->hash, k) = t;
    ++idx->n;
}